

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

void __thiscall CPU::EOR_IM(CPU *this)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  
  this->cycles = 2;
  iVar2 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)this->pc);
  this->pc = this->pc + 1;
  this->cycles = this->cycles - 1;
  bVar1 = this->A;
  bVar3 = bVar1 ^ (byte)iVar2;
  this->A = bVar3;
  (this->field_6).ps = bVar3 & 0x80 | (bVar1 == (byte)iVar2) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::EOR_IM()
{
    cycles = 2;
    A ^= GetByte();
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}